

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDecoder.cpp
# Opt level: O3

optional<std::array<int,_3UL>_>
ZXing::DataMatrix::DecodedBitStreamParser::DecodeNextTriple(BitSource *bits)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  optional<std::array<int,_3UL>_> oVar8;
  
  iVar2 = BitSource::available(bits);
  if (0xf < iVar2) {
    iVar2 = BitSource::readBits(bits,8);
    if (iVar2 != 0xfe) {
      iVar3 = BitSource::readBits(bits,8);
      uVar1 = (iVar3 + iVar2 * 0x100 + -1) / 0x640;
      uVar4 = (ulong)uVar1;
      iVar2 = iVar2 * 0x100 + iVar3 + uVar1 * -0x640 + -1;
      uVar6 = (ulong)(uint)(iVar2 % 0x28);
      uVar5 = (ulong)(uint)(iVar2 / 0x28) << 0x20;
      uVar7 = 0x100000000;
      goto LAB_0014e14b;
    }
  }
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
LAB_0014e14b:
  oVar8.super__Optional_base<std::array<int,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<int,_3UL>_>._8_8_ = uVar6 | uVar7;
  oVar8.super__Optional_base<std::array<int,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<int,_3UL>_>._M_payload._0_8_ = uVar4 | uVar5;
  return (optional<std::array<int,_3UL>_>)
         oVar8.super__Optional_base<std::array<int,_3UL>,_true,_true>._M_payload.
         super__Optional_payload_base<std::array<int,_3UL>_>;
}

Assistant:

std::optional<std::array<int, 3>> DecodeNextTriple(BitSource& bits)
{
	// Values are encoded in a 16-bit value as (1600 * C1) + (40 * C2) + C3 + 1
	// If there is less than 2 bytes left or the next byte is the unlatch codeword then the current segment has ended
	if (bits.available() < 16)
		return {};
	int firstByte = bits.readBits(8);
	if (firstByte == 254) // Unlatch codeword
		return {};

	int fullBitValue = (firstByte << 8) + bits.readBits(8) - 1;
	int a = fullBitValue / 1600;
	fullBitValue -= a * 1600;
	int b = fullBitValue / 40;
	int c = fullBitValue - b * 40;

	return {{a, b, c}};
}